

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

RequestHolder * __thiscall
ot::commissioner::coap::Coap::RequestsCache::Match(RequestsCache *this,Response *aResponse)

{
  Message *aMessage;
  _Base_ptr this_00;
  bool bVar1;
  RequestHolder *in_RAX;
  _Rb_tree_node_base *p_Var2;
  RequestHolder *local_38;
  
  p_Var2 = (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->mContainer)._M_t._M_impl.super__Rb_tree_header) {
      return (RequestHolder *)0x0;
    }
    aMessage = *(Message **)(p_Var2 + 1);
    this_00 = p_Var2[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      }
    }
    if (aResponse->mEndpoint == aMessage->mEndpoint) {
      local_38 = (RequestHolder *)(p_Var2 + 1);
      if ((undefined1  [12])((undefined1  [12])aResponse->mHeader & (undefined1  [12])0x8) !=
          (undefined1  [12])0x0) {
        if ((aResponse->mHeader).mMessageId == (aMessage->mHeader).mMessageId) goto LAB_001faeba;
        goto LAB_001fae72;
      }
      bVar1 = Message::IsTokenEqual(aResponse,aMessage);
      if (!bVar1) goto LAB_001fae72;
LAB_001faeba:
      bVar1 = false;
    }
    else {
LAB_001fae72:
      bVar1 = true;
      local_38 = in_RAX;
    }
    if (this_00 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (!bVar1) {
      return local_38;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    in_RAX = local_38;
  } while( true );
}

Assistant:

const Coap::RequestHolder *Coap::RequestsCache::Match(const Response &aResponse) const
{
    for (const auto &requestHolder : mContainer)
    {
        const auto request = requestHolder.mRequest;

        if (aResponse.GetEndpoint() == request->GetEndpoint())
        {
            switch (aResponse.GetType())
            {
            case Type::kReset:
            case Type::kAcknowledgment:
                if (aResponse.GetMessageId() == request->GetMessageId())
                {
                    return &requestHolder;
                }
                break;
            case Type::kConfirmable:
            case Type::kNonConfirmable:
                if (aResponse.IsTokenEqual(*request))
                {
                    return &requestHolder;
                }
                break;
            }
        }
    }
    return nullptr;
}